

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O3

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,half *value)

{
  bool bVar1;
  half hVar2;
  undefined8 in_RAX;
  float v;
  float local_14;
  
  local_14 = (float)((ulong)in_RAX >> 0x20);
  bVar1 = ReadBasicType(this,&local_14);
  if (bVar1) {
    hVar2 = tinyusdz::value::float_to_half_full(local_14);
    value->value = (uint16_t)hVar2;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::half *value) {
  // Parse as float
  float v;
  if (!ReadBasicType(&v)) {
    return false;
  }

  (*value) = value::float_to_half_full(v);
  return true;
}